

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::TryDecimalStringCast<duckdb::hugeint_t,(char)44>
               (char *string_ptr,idx_t string_size,hugeint_t *result,uint8_t width,uint8_t scale)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  idx_t iVar11;
  ExponentData exponent;
  DecimalCastData<duckdb::hugeint_t> local_60;
  hugeint_t *local_38;
  
  uVar10 = 0;
  local_38 = result;
  hugeint_t::hugeint_t(&local_60.result,0);
  local_60.digit_count = '\0';
  local_60.decimal_count = '\0';
  local_60.round_set = false;
  local_60.should_round = false;
  local_60.excessive_decimals = '\0';
  local_60.exponent_type = NONE;
  uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000009,width) << 4);
  local_60.limit.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar7);
  local_60.limit.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar7 + 8);
  while( true ) {
    uVar7 = string_size - uVar10;
    if (uVar7 == 0) {
      return false;
    }
    bVar3 = string_ptr[uVar10];
    if ((4 < bVar3 - 9) && (bVar3 != 0x20)) break;
    uVar10 = uVar10 + 1;
  }
  local_60.width = width;
  local_60.scale = scale;
  if (bVar3 == 0x2d) {
    uVar8 = string_size - uVar10;
    uVar7 = 1;
    while (uVar5 = uVar7, uVar5 < uVar8) {
      bVar3 = string_ptr[uVar10 + uVar5];
      if (9 < (byte)(bVar3 - 0x30)) {
        if (bVar3 != 0x2c) goto LAB_019af09d;
        uVar7 = uVar5 + 1;
        uVar4 = uVar7;
        goto LAB_019aef19;
      }
      bVar2 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                        (&local_60,bVar3 - 0x30);
      if ((!bVar2) ||
         (((uVar7 = uVar8, ~uVar5 + string_size != uVar10 &&
           (uVar7 = uVar5 + 1, string_ptr[uVar10 + 1 + uVar5] == '_')) &&
          (((string_size - uVar5) - 2 == uVar10 ||
           (uVar7 = uVar5 + 2, 9 < (byte)(string_ptr[uVar10 + 2 + uVar5] - 0x30U))))))) {
        return false;
      }
    }
LAB_019aeee3:
    bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_60);
    if (!bVar2) {
      return false;
    }
    if (uVar5 < 2) {
      return false;
    }
    goto LAB_019aefe5;
  }
  if (bVar3 == 0x30 && string_size - 1 != uVar10) {
    bVar2 = (bool)string_ptr[uVar10 + 1];
    if (bVar2 == true) {
LAB_019aefa1:
      if ((string_size - uVar10) - 3 < 0xfffffffffffffffe) {
        return false;
      }
      DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(&local_60);
      return false;
    }
    if (bVar2 != true) {
      if (bVar2 == true) goto LAB_019aefa1;
      if (bVar2 != true) goto LAB_019aee54;
    }
    bVar2 = IntegerHexCastLoop<duckdb::DecimalCastData<duckdb::hugeint_t>,false,false,duckdb::DecimalCastOperation>
                      (string_ptr + uVar10 + 1,~uVar10 + string_size,&local_60,bVar2);
LAB_019aee47:
    if (bVar2 == false) {
      return false;
    }
  }
  else {
LAB_019aee54:
    uVar5 = (ulong)(bVar3 == 0x2b);
    uVar8 = uVar5;
    while (uVar4 = uVar8, uVar8 = uVar4, uVar4 < uVar7) {
      bVar3 = string_ptr[uVar10 + uVar4];
      if (9 < (byte)(bVar3 - 0x30)) {
        if (bVar3 != 0x2c) goto LAB_019af0f4;
        uVar6 = uVar4 + 1;
        uVar1 = uVar6;
        goto LAB_019af007;
      }
      bVar2 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                        (&local_60,bVar3 - 0x30);
      if (!bVar2) {
        return false;
      }
      uVar8 = uVar7;
      if ((~uVar4 + string_size != uVar10) &&
         (uVar8 = uVar4 + 1, string_ptr[uVar10 + 1 + uVar4] == '_')) {
        if ((string_size - uVar4) - 2 == uVar10) {
          return false;
        }
        uVar8 = uVar4 + 2;
        if (9 < (byte)(string_ptr[uVar10 + 2 + uVar4] - 0x30U)) {
          return false;
        }
      }
    }
LAB_019aefcc:
    bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                      (&local_60);
    if (!bVar2) {
      return false;
    }
    if (uVar8 <= uVar5) {
      return false;
    }
  }
LAB_019aefe5:
  local_38->lower = local_60.result.lower;
  local_38->upper = local_60.result.upper;
  return true;
LAB_019aef19:
  uVar6 = uVar4;
  if (uVar6 < uVar8) {
    bVar3 = string_ptr[uVar10 + uVar6];
    if ((byte)(bVar3 - 0x30) < 10) goto code_r0x019aef3e;
    bVar2 = uVar5 < 2;
    uVar5 = uVar6;
    if (uVar6 <= uVar7 && bVar2) {
      return false;
    }
LAB_019af09d:
    if (bVar3 - 9 < 5) {
LAB_019af0ac:
      uVar7 = uVar5 + 1;
      uVar5 = uVar7;
      if (uVar7 < uVar8) {
        uVar5 = uVar8;
      }
      for (; uVar7 < uVar8; uVar7 = uVar7 + 1) {
        if (0x20 < (ulong)(byte)string_ptr[uVar10 + uVar7]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar10 + uVar7] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_019aeee3;
    }
    if ((bVar3 != 0x65) && (bVar3 != 0x45)) {
      if (bVar3 != 0x20) {
        return false;
      }
      goto LAB_019af0ac;
    }
    if (uVar5 == 1) {
      return false;
    }
    if (uVar8 <= uVar5 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar9 = string_ptr + uVar10 + uVar5 + 1;
    iVar11 = ~uVar10 + (string_size - uVar5);
    bVar2 = SUB41(bVar3 - 9,0);
    if (*pcVar9 == '-') {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                        (pcVar9,iVar11,&exponent,bVar2);
    }
    else {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                        (pcVar9,iVar11,&exponent,bVar2);
    }
    if (bVar2 == false) {
      return false;
    }
    bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_60,(int)exponent.result);
    goto LAB_019aee47;
  }
  bVar2 = uVar5 < 2;
  uVar5 = uVar6;
  if (uVar6 <= uVar7 && bVar2) {
    return false;
  }
  goto LAB_019aeee3;
code_r0x019aef3e:
  bVar2 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true>
                    (&local_60,bVar3 - 0x30);
  if (!bVar2) {
    return false;
  }
  uVar4 = uVar8;
  if ((~uVar6 + string_size != uVar10) && (uVar4 = uVar6 + 1, string_ptr[uVar10 + 1 + uVar6] == '_')
     ) {
    if ((string_size - uVar6) - 2 == uVar10) {
      return false;
    }
    uVar4 = uVar6 + 2;
    if (9 < (byte)(string_ptr[uVar10 + 2 + uVar6] - 0x30U)) {
      return false;
    }
  }
  goto LAB_019aef19;
LAB_019af007:
  uVar8 = uVar1;
  if (uVar8 < uVar7) {
    bVar3 = string_ptr[uVar10 + uVar8];
    if ((byte)(bVar3 - 0x30) < 10) goto code_r0x019af02c;
    bVar2 = uVar4 <= uVar5;
    uVar4 = uVar8;
    if (uVar8 <= uVar6 && bVar2) {
      return false;
    }
LAB_019af0f4:
    if (bVar3 - 9 < 5) {
LAB_019af0ff:
      uVar4 = uVar4 + 1;
      uVar8 = uVar4;
      if (uVar4 < uVar7) {
        uVar8 = uVar7;
      }
      for (; uVar4 < uVar7; uVar4 = uVar4 + 1) {
        if (0x20 < (ulong)(byte)string_ptr[uVar10 + uVar4]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar10 + uVar4] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_019aefcc;
    }
    if ((bVar3 != 0x65) && (bVar3 != 0x45)) {
      if (bVar3 != 0x20) {
        return false;
      }
      goto LAB_019af0ff;
    }
    if (uVar4 == uVar5) {
      return false;
    }
    if (uVar7 <= uVar4 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar9 = string_ptr + uVar10 + uVar4 + 1;
    iVar11 = ~uVar10 + (string_size - uVar4);
    bVar2 = SUB41(bVar3 - 9,0);
    if (*pcVar9 == '-') {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                        (pcVar9,iVar11,&exponent,bVar2);
    }
    else {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                        (pcVar9,iVar11,&exponent,bVar2);
    }
    if (bVar2 == false) {
      return false;
    }
    bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                      (&local_60,(int)exponent.result);
    goto LAB_019aee47;
  }
  if (uVar8 <= uVar6 && uVar4 <= uVar5) {
    return false;
  }
  goto LAB_019aefcc;
code_r0x019af02c:
  bVar2 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,false,true>
                    (&local_60,bVar3 - 0x30);
  if (!bVar2) {
    return false;
  }
  uVar1 = uVar7;
  if ((~uVar8 + string_size != uVar10) && (uVar1 = uVar8 + 1, string_ptr[uVar10 + 1 + uVar8] == '_')
     ) {
    if ((string_size - uVar8) - 2 == uVar10) {
      return false;
    }
    uVar1 = uVar8 + 2;
    if (9 < (byte)(string_ptr[uVar10 + 2 + uVar8] - 0x30U)) {
      return false;
    }
  }
  goto LAB_019af007;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}